

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibSample.c
# Opt level: O0

int main(int ArgC,char **ArgV)

{
  char *local_130;
  char *outputJsonString;
  size_t errorAtPos;
  char *pcStack_118;
  JL_STATUS jlStatus;
  char *inputJsonString;
  char *pcStack_108;
  _Bool success;
  char *inputFilename;
  SampleConfigStruct myConfig;
  size_t marshalSampleConfigStructCount;
  JlMarshallElement marshalSampleConfigStruct [2];
  int local_1c;
  int result;
  char **ArgV_local;
  int ArgC_local;
  
  local_1c = 0;
  memcpy(&marshalSampleConfigStructCount,&DAT_0010cd30,0xc0);
  myConfig.NumRuns = 2;
  myConfig._12_4_ = 0;
  memset(&inputFilename,0,0x10);
  if (ArgC == 2) {
    pcStack_108 = ArgV[1];
    pcStack_118 = (char *)0x0;
    outputJsonString = (char *)0x0;
    inputJsonString._7_1_ = ReadFileIntoMemory(pcStack_108,&stack0xfffffffffffffee8);
    if ((bool)inputJsonString._7_1_) {
      errorAtPos._4_4_ =
           JlJsonToStruct(pcStack_118,(JlMarshallElement *)&marshalSampleConfigStructCount,
                          myConfig._8_8_,&inputFilename,(size_t *)&outputJsonString);
      if (errorAtPos._4_4_ == JL_STATUS_SUCCESS) {
        myConfig.Name._0_4_ = (uint)myConfig.Name + 1;
      }
      else {
        printf("Failed to parse json in file: %s Position: %u\n",pcStack_108,
               (ulong)outputJsonString & 0xffffffff);
        local_1c = 3;
        inputJsonString._7_1_ = 0;
      }
    }
    else {
      inputFilename = (char *)WjTestLib_Calloc(0x20,1);
      strcpy(inputFilename,"Example Json File");
      myConfig.Name._0_4_ = 1;
      inputJsonString._7_1_ = 1;
    }
    if ((inputJsonString._7_1_ & 1) != 0) {
      printf("Name: %s\nNumRuns: %u\n",inputFilename,(ulong)(uint)myConfig.Name);
      local_130 = (char *)0x0;
      errorAtPos._4_4_ =
           JlStructToJson(&inputFilename,(JlMarshallElement *)&marshalSampleConfigStructCount,
                          myConfig._8_8_,true,&local_130);
      if (errorAtPos._4_4_ == JL_STATUS_SUCCESS) {
        inputJsonString._7_1_ = SaveTextFile(pcStack_108,local_130);
        if (!(bool)inputJsonString._7_1_) {
          printf("Failed to write Json back out to file: %s\n",pcStack_108);
          local_1c = 5;
        }
        JlFreeJsonStringBuffer(&local_130);
      }
      else {
        printf("Failed to generate Json\n");
        local_1c = 4;
      }
      JlUnmarshallFreeStructAllocs
                ((JlMarshallElement *)&marshalSampleConfigStructCount,myConfig._8_8_,&inputFilename)
      ;
    }
  }
  else {
    printf("Syntax:\n  JsonLibSample <SampleJsonFile>\n\n");
    local_1c = 1;
  }
  return local_1c;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    // The structure that represents the JSON file
    typedef struct
    {
        char* Name;
        uint32_t NumRuns;
    } SampleConfigStruct;

    // Mapping of JSON elements to structure elements
    JlMarshallElement marshalSampleConfigStruct[] =
    {
        JlMarshallString( SampleConfigStruct, Name, "Name" ),
        JlMarshallUnsigned( SampleConfigStruct, NumRuns, "NumRuns" ),
    };
    size_t marshalSampleConfigStructCount = sizeof(marshalSampleConfigStruct)/sizeof(marshalSampleConfigStruct[0]);

    SampleConfigStruct myConfig = {0};

    if( 2 != ArgC )
    {
        printf(
            "Syntax:\n"
            "  JsonLibSample <SampleJsonFile>\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;
        JL_STATUS jlStatus;
        size_t errorAtPos = 0;

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {

            // Unmarshall the JSON into the structure.
            jlStatus = JlJsonToStruct( inputJsonString, marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Increment the run count
                myConfig.NumRuns += 1;
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
                success = false;
            }
        }
        else
        {
            // No Json file, so create new struct
            myConfig.Name = JlAlloc( 32 );
            strcpy( myConfig.Name, "Example Json File" );
            myConfig.NumRuns = 1;
            success = true;
        }

        if( success )
        {
            // Print info
            printf( "Name: %s\nNumRuns: %u\n", myConfig.Name, myConfig.NumRuns );

            // Now generate new Json
            char* outputJsonString = NULL;
            jlStatus = JlStructToJson( &myConfig, marshalSampleConfigStruct, marshalSampleConfigStructCount, true, &outputJsonString );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                // Save json file back out
                success = SaveTextFile( inputFilename, outputJsonString );
                if( success )
                {
                    // Success
                }
                else
                {
                    printf( "Failed to write Json back out to file: %s\n", inputFilename );
                    result = 5;
                }

                JlFreeJsonStringBuffer( &outputJsonString );
            }
            else
            {
                printf( "Failed to generate Json\n" );
                result = 4;
            }

            JlUnmarshallFreeStructAllocs( marshalSampleConfigStruct, marshalSampleConfigStructCount, &myConfig );
        }
    }

    return result;
}